

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O2

void OPN2_ChGenerate(ym3438_t *chip)

{
  byte bVar1;
  Bit16s BVar2;
  uint uVar3;
  ulong uVar4;
  short sVar5;
  short sVar6;
  ushort uVar7;
  Bit16s BVar8;
  
  uVar3 = chip->channel;
  uVar4 = (ulong)(chip->cycles + 0x12) % 0x18;
  bVar1 = chip->mode_test_2c[5];
  uVar7 = (ushort)bVar1;
  if (*(int *)((ulong)(byte)((ushort)uVar4 / 6) * 0xc0 + 0x1dd870 + (ulong)chip->connect[uVar3] * 4)
      != 0 && bVar1 == 0) {
    uVar7 = (ushort)((uint)(int)chip->fm_out[uVar4] >> 5);
  }
  BVar2 = chip->ch_acc[uVar3];
  if ((uint)uVar4 < 6 || bVar1 != 0) {
    chip->ch_out[uVar3] = BVar2;
  }
  BVar8 = 0;
  if (bVar1 != 0) {
    BVar8 = BVar2;
  }
  if (5 < (uint)uVar4) {
    BVar8 = BVar2;
  }
  sVar6 = -0x100;
  if (-0x100 < (short)(uVar7 + BVar8)) {
    sVar6 = uVar7 + BVar8;
  }
  sVar5 = 0xff;
  if (sVar6 < 0xff) {
    sVar5 = sVar6;
  }
  chip->ch_acc[uVar3] = sVar5;
  return;
}

Assistant:

void OPN2_ChGenerate(ym3438_t *chip)
{
    Bit32u slot = (chip->cycles + 18) % 24;
    Bit32u channel = chip->channel;
    Bit32u op = slot / 6;
    Bit32u test_dac = chip->mode_test_2c[5];
    Bit16s acc = chip->ch_acc[channel];
    Bit16s add = test_dac;
    Bit16s sum = 0;
    if (op == 0 && !test_dac)
    {
        acc = 0;
    }
    if (fm_algorithm[op][5][chip->connect[channel]] && !test_dac)
    {
        add += chip->fm_out[slot] >> 5;
    }
    sum = acc + add;
    /* Clamp */
    if (sum > 255)
    {
        sum = 255;
    }
    else if(sum < -256)
    {
        sum = -256;
    }

    if (op == 0 || test_dac)
    {
        chip->ch_out[channel] = chip->ch_acc[channel];
    }
    chip->ch_acc[channel] = sum;
}